

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::Init
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this,ushort objectSize,
          ushort objectCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (this->disposedObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,600,"(this->disposedObjectList == nullptr)",
                       "this->disposedObjectList == nullptr");
    if (!bVar3) goto LAB_0028e298;
    *puVar1 = 0;
  }
  if (this->disposedObjectListTail != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x259,"(this->disposedObjectListTail == nullptr)",
                       "this->disposedObjectListTail == nullptr");
    if (!bVar3) goto LAB_0028e298;
    *puVar1 = 0;
  }
  if (this->finalizeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x25a,"(this->finalizeCount == 0)","this->finalizeCount == 0");
    if (!bVar3) goto LAB_0028e298;
    *puVar1 = 0;
  }
  if (this->pendingDisposeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x25b,"(this->pendingDisposeCount == 0)","this->pendingDisposeCount == 0");
    if (!bVar3) {
LAB_0028e298:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  SmallHeapBlockT<SmallAllocationBlockAttributes>::Init
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,objectSize,objectCount);
  return;
}

Assistant:

void
SmallFinalizableHeapBlockT<TBlockAttributes>::Init(ushort objectSize, ushort objectCount)
{
    Assert(this->disposedObjectList == nullptr);
    Assert(this->disposedObjectListTail == nullptr);
    Assert(this->finalizeCount == 0);
    Assert(this->pendingDisposeCount == 0);
    __super::Init(objectSize, objectCount);
}